

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

void __thiscall dtc::fdt::property_value::push_to_buffer(property_value *this,byte_buffer *buffer)

{
  uchar local_9;
  
  if ((this->byte_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->byte_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)buffer,
               (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    return;
  }
  push_string(buffer,&this->string_data,true);
  local_9 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (buffer,&local_9);
  return;
}

Assistant:

void
property_value::push_to_buffer(byte_buffer &buffer)
{
	if (!byte_data.empty())
	{
		buffer.insert(buffer.end(), byte_data.begin(), byte_data.end());
	}
	else
	{
		push_string(buffer, string_data, true);
		// Trailing nul
		buffer.push_back(0);
	}
}